

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall
optimization::common_expr_del::BlockNodes::export_insts(BlockNodes *this,BasicBlk *block)

{
  _List_iterator<unsigned_int> __first;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  __shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar4;
  size_type sVar5;
  ExtraNormOp *pEVar6;
  reference pvVar7;
  InNormOp *pIVar8;
  element_type *peVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  reference __s;
  char *pcVar11;
  NodeId *pNVar12;
  VarId *pVVar13;
  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
  *this_01;
  mapped_type *pmVar14;
  pointer pIVar15;
  difference_type dVar16;
  reference puVar17;
  mapped_type *pmVar18;
  element_type *peVar19;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  long in_RSI;
  byte *in_RDI;
  VarId var_5;
  iterator __end5_1;
  iterator __begin5_1;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range5_1;
  VarId var_4;
  iterator __end5;
  iterator __begin5;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range5;
  VarId var_3;
  optional<mir::inst::VarId> not_phi_var;
  value_type *node_3;
  uint idx_3;
  iterator __end2_2;
  iterator __begin2_2;
  list<unsigned_int,_std::allocator<unsigned_int>_> *__range2_2;
  Var_Replace vp;
  int idx_2;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  iterator iter_1;
  VarId var;
  value_type *node;
  VarId varId;
  JumpInstruction *jump;
  __single_object assignInst_2;
  VarId var_2;
  iterator __end4;
  iterator __begin4;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range4;
  value_type *node_2;
  uint idx_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  __single_object storeInst;
  __single_object loadInst_2;
  Value offset_2;
  Value dest;
  Value val_1;
  __single_object loadInst_1;
  __single_object loadInst;
  Value offset_1;
  Value src_1;
  __single_object phiInst;
  __single_object assignInst_1;
  VarId var_1;
  value_type oper_node;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  operand_3;
  iterator __end7_2;
  iterator __begin7_2;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range7_2;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> vars;
  __single_object callInst_1;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  operand_2;
  iterator __end7_1;
  iterator __begin7_1;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range7_1;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> func_1;
  __single_object callInst;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  operand_1;
  iterator __end7;
  iterator __begin7;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range7;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> func;
  __single_object assignInst;
  NodeId srcId;
  value_type operand;
  Value src;
  __single_object ptrInst;
  Value offset;
  VarId ptr;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  val;
  __single_object opInst;
  Value rhs;
  Value lhs;
  size_t opKind;
  value_type *node_1;
  uint idx;
  iterator __end2;
  iterator __begin2;
  list<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  int i;
  iterator iter;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *inst;
  undefined4 in_stack_fffffffffffff548;
  int32_t in_stack_fffffffffffff54c;
  Var_Replace *in_stack_fffffffffffff550;
  _List_iterator<unsigned_int> in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  uint32_t in_stack_fffffffffffff564;
  const_iterator in_stack_fffffffffffff568;
  mapped_type *in_stack_fffffffffffff570;
  BlockNodes *in_stack_fffffffffffff578;
  key_type *in_stack_fffffffffffff588;
  map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
  *in_stack_fffffffffffff590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff598;
  Value *in_stack_fffffffffffff5a0;
  Value *in_stack_fffffffffffff5a8;
  VarId *in_stack_fffffffffffff5b0;
  Value *in_stack_fffffffffffff5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5c0;
  BlockNodes *in_stack_fffffffffffff5c8;
  MirFunction *in_stack_fffffffffffff5d0;
  VarId *in_stack_fffffffffffff5d8;
  Node *in_stack_fffffffffffff640;
  VarId *in_stack_fffffffffffff680;
  VarId *in_stack_fffffffffffff688;
  Var_Replace *in_stack_fffffffffffff690;
  MirFunction *in_stack_fffffffffffff6b8;
  Var_Replace *in_stack_fffffffffffff6c0;
  undefined1 local_848 [48];
  _Self local_818;
  _Self local_810;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *local_808;
  _Self local_7f0;
  _Self local_7e8;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *local_7e0;
  reference local_7b0;
  uint local_7a4;
  _Self local_7a0;
  _Self local_798;
  byte *local_790;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_720;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_710;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_708;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_700;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_6f8;
  undefined4 local_6ec;
  reference local_6e8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_6e0;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_6d8;
  VarId local_6d0;
  reference local_6c0;
  long local_6a8;
  VarId local_690;
  _Self local_680;
  _Self local_678;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *local_670;
  reference local_668;
  uint local_65c;
  _Self local_658;
  _Self local_650;
  byte *local_648;
  undefined1 local_640 [416];
  VarId local_4a0 [4];
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_458;
  __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_450;
  element_type *local_448;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3a8;
  __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_3a0;
  element_type *local_398;
  string local_378 [32];
  Var_Replace local_358;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d8;
  __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2d0;
  element_type *local_2c8;
  string local_2a8 [84];
  uint local_254;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250 [12];
  char *local_70;
  reference local_68;
  uint local_5c;
  _Self local_58;
  _Self local_50;
  byte *local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  int local_2c;
  shared_ptr<optimization::common_expr_del::Node> *local_28;
  __normal_iterator<std::shared_ptr<optimization::common_expr_del::Node>_*,_std::vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>_>
  local_20;
  MirFunction *local_18;
  long local_10;
  
  local_18 = (MirFunction *)(in_RSI + 0x40);
  local_10 = in_RSI;
  local_20._M_current =
       (shared_ptr<optimization::common_expr_del::Node> *)
       std::
       vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
       ::begin((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  while( true ) {
    local_28 = (shared_ptr<optimization::common_expr_del::Node> *)
               std::
               vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
               ::end((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                      *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<optimization::common_expr_del::Node>_*,_std::vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>_>
                        *)in_stack_fffffffffffff550,
                       (__normal_iterator<std::shared_ptr<optimization::common_expr_del::Node>_*,_std::vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::shared_ptr<optimization::common_expr_del::Node>_*,_std::vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>_>
               ::operator->(&local_20)->
               super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_00)
    ;
    Node::init_main_var(in_stack_fffffffffffff640);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<optimization::common_expr_del::Node>_*,_std::vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>_>
    ::operator++(&local_20);
  }
  while( true ) {
    sVar4 = std::
            map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
            ::size((map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                    *)0x16a8a2);
    sVar5 = std::
            vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
            ::size((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                    *)(in_RDI + 8));
    if (sVar5 <= sVar4) break;
    sVar5 = std::
            vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
            ::size((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                    *)(in_RDI + 8));
    local_2c = (int)sVar5;
    while (local_2c = local_2c + -1, -1 < local_2c) {
      exportNode(in_stack_fffffffffffff5c8,(uint32_t)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
    }
  }
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *)0x16a92a);
  local_38 = (_List_node_base *)
             std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  local_40 = (_List_node_base *)
             std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  __first._M_node._4_4_ = in_stack_fffffffffffff564;
  __first._M_node._0_4_ = in_stack_fffffffffffff560;
  std::reverse<std::_List_iterator<unsigned_int>>(__first,in_stack_fffffffffffff558);
  local_48 = in_RDI + 0xc0;
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                 ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  local_58._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                 ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
    puVar17 = std::_List_iterator<unsigned_int>::operator*((_List_iterator<unsigned_int> *)0x16a9e2)
    ;
    local_5c = *puVar17;
    pcVar11 = (char *)(ulong)local_5c;
    local_68 = std::
               vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
               ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                             *)(in_RDI + 8),(size_type)pcVar11);
    peVar19 = std::
              __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x16aa1a);
    if ((peVar19->is_leaf & 1U) == 0) {
      peVar19 = std::
                __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x16aa34);
      local_70 = std::
                 variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 ::index(&peVar19->op,pcVar11,__c);
      if (local_70 == (char *)0x0) {
        peVar19 = std::
                  __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x16aa97);
        std::
        vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&peVar19->operands,0);
        std::
        variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff550,
                  (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
        convert_operand_to_value(in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570);
        std::
        variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x16aae7);
        peVar19 = std::
                  __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x16aaf4);
        std::
        vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&peVar19->operands,1);
        std::
        variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff550,
                  (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
        convert_operand_to_value(in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570);
        std::
        variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x16ab45);
        std::
        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16ab52);
        std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x16ab5e);
        std::
        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16ab73);
        std::
        get<mir::inst::Op,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                  ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                    *)0x16ab7f);
        std::
        make_unique<mir::inst::OpInst,mir::inst::VarId&,mir::inst::Value&,mir::inst::Value&,mir::inst::Op&>
                  (in_stack_fffffffffffff5d8,(Value *)in_stack_fffffffffffff5d0,
                   (Value *)in_stack_fffffffffffff5c8,(Op *)in_stack_fffffffffffff5c0);
        std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
        unique_ptr<mir::inst::OpInst,std::default_delete<mir::inst::OpInst>,void>
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                   (unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)
                   in_stack_fffffffffffff558._M_node);
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)in_stack_fffffffffffff550,
                    (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
        std::unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)
                   in_stack_fffffffffffff550);
      }
      else if (local_70 == (char *)0x1) {
        std::
        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16ac9e);
        pEVar6 = std::
                 get<optimization::common_expr_del::ExtraNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                           ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                             *)0x16acaa);
        switch(*pEVar6) {
        case Ref:
          std::
          variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x16ace3);
          peVar19 = std::
                    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x16acf0);
          pcVar11 = (char *)0x0;
          pvVar7 = std::
                   vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar19->operands,0);
          pcVar11 = std::
                    variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::index(pvVar7,pcVar11,__c_00);
          if (pcVar11 == (char *)0x1) {
            peVar19 = std::
                      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x16ad2f);
            std::
            vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&peVar19->operands,0);
            pNVar12 = std::
                      get<optimization::common_expr_del::NodeId,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x16ad43);
            std::
            vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
            ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                          *)(in_RDI + 8),(ulong)pNVar12->id);
            std::
            __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16ad6e);
            std::get<mir::inst::VarId,int,mir::inst::VarId>
                      ((variant<int,_mir::inst::VarId> *)0x16ad7a);
            std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                      ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff570,(VarId *)in_stack_fffffffffffff568._M_current);
          }
          else {
            peVar19 = std::
                      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x16adc1);
            std::
            vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&peVar19->operands,0);
            std::
            get<std::__cxx11::string,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                      ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16add5);
            std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                      ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
          }
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16ae15);
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x16ae21);
          std::
          make_unique<mir::inst::RefInst,mir::inst::VarId&,std::variant<mir::inst::VarId,std::__cxx11::string>&>
                    ((VarId *)in_stack_fffffffffffff5a8,
                     (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff5a0);
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<mir::inst::RefInst,std::default_delete<mir::inst::RefInst>,void>
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                     (unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     in_stack_fffffffffffff558._M_node);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff550,
                      (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
          std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     in_stack_fffffffffffff550);
          std::
          variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x16aea5);
          break;
        case Ptroffset:
          peVar19 = std::
                    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x16aef7);
          std::
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&peVar19->operands,0);
          std::
          variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffff550,
                    (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          convert_operand_to_value(in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570);
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x16af47);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffff550,
                     (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          std::
          variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x16af73);
          peVar19 = std::
                    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x16af80);
          std::
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&peVar19->operands,1);
          std::
          variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffff550,
                    (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          convert_operand_to_value(in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570);
          std::
          variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x16afd1);
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16afde);
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x16afea);
          std::
          make_unique<mir::inst::PtrOffsetInst,mir::inst::VarId&,mir::inst::VarId&,mir::inst::Value&>
                    ((VarId *)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                     in_stack_fffffffffffff5a8);
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<mir::inst::PtrOffsetInst,std::default_delete<mir::inst::PtrOffsetInst>,void>
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                     (unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>
                      *)in_stack_fffffffffffff558._M_node);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff550,
                      (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
          std::unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>
          ::~unique_ptr((unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>
                         *)in_stack_fffffffffffff550);
          break;
        case Assign:
          mir::inst::Value::Value((Value *)in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
          peVar19 = std::
                    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x16b110);
          pvVar7 = std::
                   vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar19->operands,0);
          std::
          variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffff550,
                    (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          pcVar11 = std::
                    variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::index(local_250,(char *)pvVar7,__c_01);
          if (pcVar11 == (char *)0x1) {
            peVar19 = std::
                      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x16b150);
            std::
            vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&peVar19->operands,0);
            pNVar12 = std::
                      get<optimization::common_expr_del::NodeId,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x16b164);
            local_254 = pNVar12->id;
            std::
            vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
            ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                          *)(in_RDI + 8),(ulong)local_254);
            std::
            __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16b1a1);
            mir::inst::Value::operator=
                      ((Value *)in_stack_fffffffffffff550,
                       (Value *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          }
          else {
            std::get<int,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                      ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16b1df);
            mir::inst::Value::Value((Value *)in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
            mir::inst::Value::operator=
                      ((Value *)in_stack_fffffffffffff550,
                       (Value *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          }
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16b228);
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x16b234);
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                    ((VarId *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                     (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                      *)in_stack_fffffffffffff558._M_node);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff550,
                      (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
          std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                       *)in_stack_fffffffffffff550);
          std::
          variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x16b2c8);
          break;
        case Call:
          peVar19 = std::
                    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x16b31a);
          peVar9 = std::
                   __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x16b32f);
          sVar5 = std::
                  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size(&peVar9->operands);
          std::
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&peVar19->operands,sVar5 - 1);
          pbVar10 = std::
                    get<std::__cxx11::string,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                              ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x16b353);
          std::__cxx11::string::string(local_2a8,(string *)pbVar10);
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16b370);
          std::
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop_back((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x16b378);
          std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)0x16b385);
          local_2c8 = std::
                      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x16b392);
          local_2d0._M_current =
               (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_2d8 = (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)std::
                         vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::end((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)in_stack_fffffffffffff550,
                                    (__normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548)
                                   ), bVar1) {
            __gnu_cxx::
            __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&local_2d0);
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff550,
                      (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff550,
                      (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            convert_operand_to_value(in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570)
            ;
            std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::push_back
                      ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                       in_stack_fffffffffffff550,
                       (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16b45b);
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16b468);
            __gnu_cxx::
            __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&local_2d0);
          }
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16b4e9);
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x16b4f5);
          std::
          make_unique<mir::inst::CallInst,mir::inst::VarId&,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                    ((VarId *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                     (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                     in_stack_fffffffffffff5b8);
          in_stack_fffffffffffff6c0 = &local_358;
          in_stack_fffffffffffff6b8 = local_18;
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<mir::inst::CallInst,std::default_delete<mir::inst::CallInst>,void>
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                     (unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                     in_stack_fffffffffffff558._M_node);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff550,
                      (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
          std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                      in_stack_fffffffffffff550);
          std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~vector
                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
          std::__cxx11::string::~string(local_2a8);
        }
      }
      else if (local_70 == (char *)0x2) {
        std::
        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16b5fd);
        pIVar8 = std::
                 get<optimization::common_expr_del::InNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                           ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                             *)0x16b609);
        if (*pIVar8 == Call) {
          peVar19 = std::
                    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x16b61f);
          peVar9 = std::
                   __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x16b634);
          sVar5 = std::
                  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size(&peVar9->operands);
          std::
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&peVar19->operands,sVar5 - 1);
          pbVar10 = std::
                    get<std::__cxx11::string,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                              ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x16b658);
          std::__cxx11::string::string(local_378,(string *)pbVar10);
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16b675);
          std::
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop_back((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x16b67d);
          std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)0x16b68a);
          local_398 = std::
                      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x16b697);
          local_3a0._M_current =
               (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_3a8 = (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)std::
                         vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::end((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)in_stack_fffffffffffff550,
                                    (__normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548)
                                   ), bVar1) {
            __gnu_cxx::
            __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&local_3a0);
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff550,
                      (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff550,
                      (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            convert_operand_to_value(in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570)
            ;
            std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::push_back
                      ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                       in_stack_fffffffffffff550,
                       (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16b760);
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16b76d);
            __gnu_cxx::
            __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&local_3a0);
          }
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16b7ee);
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x16b7fa);
          std::
          make_unique<mir::inst::CallInst,mir::inst::VarId&,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                    ((VarId *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                     (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                     in_stack_fffffffffffff5b8);
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<mir::inst::CallInst,std::default_delete<mir::inst::CallInst>,void>
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                     (unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                     in_stack_fffffffffffff558._M_node);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff550,
                      (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
          std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                      in_stack_fffffffffffff550);
          std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~vector
                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
          std::__cxx11::string::~string(local_378);
        }
        std::
        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16b8ff);
        pIVar8 = std::
                 get<optimization::common_expr_del::InNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                           ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                             *)0x16b90b);
        if (*pIVar8 == Phi) {
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x16b921);
          local_448 = std::
                      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x16b92e);
          local_450._M_current =
               (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_458 = (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)std::
                         vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::end((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)in_stack_fffffffffffff550,
                                    (__normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548)
                                   ), bVar1) {
            __gnu_cxx::
            __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&local_450);
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff550,
                      (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            in_stack_fffffffffffff688 = (VarId *)(in_RDI + 8);
            in_stack_fffffffffffff690 =
                 (Var_Replace *)
                 std::
                 get<optimization::common_expr_del::NodeId,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                           ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x16b9be);
            __s = std::
                  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                                *)in_stack_fffffffffffff688,
                               (ulong)*(uint *)&in_stack_fffffffffffff690->func);
            std::shared_ptr<optimization::common_expr_del::Node>::shared_ptr
                      ((shared_ptr<optimization::common_expr_del::Node> *)in_stack_fffffffffffff550,
                       (shared_ptr<optimization::common_expr_del::Node> *)
                       CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff550);
            peVar19 = std::
                      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x16ba0d);
            pcVar11 = std::variant<int,_mir::inst::VarId>::index
                                ((variant<int,_mir::inst::VarId> *)&(peVar19->mainVar).field_0x8,
                                 (char *)__s,__c_02);
            if (pcVar11 == (char *)0x0) {
              std::
              __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x16ba34);
              sVar5 = std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                                ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 in_stack_fffffffffffff550);
              if (sVar5 == 0) {
                std::
                __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x16bacc);
                std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::front
                          ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           in_stack_fffffffffffff550);
                in_stack_fffffffffffff680 = local_4a0;
                mir::inst::VarId::operator=
                          ((VarId *)in_stack_fffffffffffff550,
                           (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                std::
                __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x16bafd);
                std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                          ((VarId *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
                std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                           (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                            *)in_stack_fffffffffffff558._M_node);
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             *)in_stack_fffffffffffff550,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
                std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                ::~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                               *)in_stack_fffffffffffff550);
              }
              else {
                std::
                __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x16ba53);
                std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::front
                          ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           in_stack_fffffffffffff550);
                mir::inst::VarId::operator=
                          ((VarId *)in_stack_fffffffffffff550,
                           (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
              }
            }
            else {
              std::
              __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x16bbba);
              std::get<mir::inst::VarId,int,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)0x16bbc6);
              mir::inst::VarId::operator=
                        ((VarId *)in_stack_fffffffffffff550,
                         (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            }
            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                      ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                       CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                       (value_type *)in_stack_fffffffffffff558._M_node);
            std::shared_ptr<optimization::common_expr_del::Node>::~shared_ptr
                      ((shared_ptr<optimization::common_expr_del::Node> *)0x16bc09);
            std::
            variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16bc16);
            __gnu_cxx::
            __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&local_450);
          }
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16bc54);
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x16bc60);
          std::
          make_unique<mir::inst::PhiInst,mir::inst::VarId&,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>&>
                    ((VarId *)in_stack_fffffffffffff598,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     in_stack_fffffffffffff590);
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<mir::inst::PhiInst,std::default_delete<mir::inst::PhiInst>,void>
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                     (unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)
                     in_stack_fffffffffffff558._M_node);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff550,
                      (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
          std::unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)
                     in_stack_fffffffffffff550);
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
        }
        else {
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16bd46);
          pIVar8 = std::
                   get<optimization::common_expr_del::InNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                             ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                               *)0x16bd52);
          if (*pIVar8 == Load) {
            peVar19 = std::
                      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x16bd7c);
            std::
            vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&peVar19->operands,0);
            pNVar12 = std::
                      get<optimization::common_expr_del::NodeId,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x16bd90);
            std::
            vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
            ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                          *)(in_RDI + 8),(ulong)pNVar12->id);
            std::
            __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16bda9);
            mir::inst::Value::Value
                      ((Value *)in_stack_fffffffffffff550,
                       (Value *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            if ((*in_RDI & 1) == 0) {
              std::
              __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x16bf36);
              std::get<mir::inst::VarId,int,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)0x16bf42);
              std::make_unique<mir::inst::LoadInst,mir::inst::Value&,mir::inst::VarId&>
                        (in_stack_fffffffffffff5a8,(VarId *)in_stack_fffffffffffff5a0);
              std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
              unique_ptr<mir::inst::LoadInst,std::default_delete<mir::inst::LoadInst>,void>
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                         (unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_>
                          *)in_stack_fffffffffffff558._M_node);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff550,
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
              std::unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_>
                           *)in_stack_fffffffffffff550);
            }
            else {
              peVar19 = std::
                        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x16bddb);
              std::
              vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&peVar19->operands,1);
              std::
              variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffff550,
                        (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
              convert_operand_to_value
                        (in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570);
              std::
              variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x16be2c);
              std::
              __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x16be39);
              std::get<mir::inst::VarId,int,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)0x16be45);
              std::
              make_unique<mir::inst::LoadOffsetInst,mir::inst::Value&,mir::inst::VarId&,mir::inst::Value&>
                        ((Value *)in_stack_fffffffffffff5c8,(VarId *)in_stack_fffffffffffff5c0,
                         in_stack_fffffffffffff5b8);
              std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
              unique_ptr<mir::inst::LoadOffsetInst,std::default_delete<mir::inst::LoadOffsetInst>,void>
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                         (unique_ptr<mir::inst::LoadOffsetInst,_std::default_delete<mir::inst::LoadOffsetInst>_>
                          *)in_stack_fffffffffffff558._M_node);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff550,
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
              std::
              unique_ptr<mir::inst::LoadOffsetInst,_std::default_delete<mir::inst::LoadOffsetInst>_>
              ::~unique_ptr((unique_ptr<mir::inst::LoadOffsetInst,_std::default_delete<mir::inst::LoadOffsetInst>_>
                             *)in_stack_fffffffffffff550);
            }
          }
          else {
            std::
            __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16c007);
            pIVar8 = std::
                     get<optimization::common_expr_del::InNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                               ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                                 *)0x16c013);
            if (*pIVar8 == Store) {
              peVar19 = std::
                        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x16c029);
              std::
              vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&peVar19->operands,0);
              std::
              variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffff550,
                        (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
              convert_operand_to_value
                        (in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570);
              std::
              variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x16c079);
              peVar19 = std::
                        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x16c086);
              std::
              vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&peVar19->operands,1);
              std::
              variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffff550,
                        (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
              convert_operand_to_value
                        (in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570);
              std::
              variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x16c0d7);
              if ((*in_RDI & 1) == 0) {
                std::get<mir::inst::VarId,int,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)0x16c290);
                in_stack_fffffffffffff5c8 = (BlockNodes *)(local_640 + 8);
                std::make_unique<mir::inst::StoreInst,mir::inst::Value&,mir::inst::VarId&>
                          (in_stack_fffffffffffff5a8,(VarId *)in_stack_fffffffffffff5a0);
                in_stack_fffffffffffff5d8 = (VarId *)local_640;
                in_stack_fffffffffffff5d0 = local_18;
                std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                unique_ptr<mir::inst::StoreInst,std::default_delete<mir::inst::StoreInst>,void>
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                           (unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_>
                            *)in_stack_fffffffffffff558._M_node);
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             *)in_stack_fffffffffffff550,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
                std::unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_>::
                ~unique_ptr((unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_>
                             *)in_stack_fffffffffffff550);
              }
              else {
                peVar19 = std::
                          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x16c0f5);
                std::
                vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar19->operands,2);
                std::
                variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffff550,
                          (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                convert_operand_to_value
                          (in_stack_fffffffffffff578,(Operand *)in_stack_fffffffffffff570);
                std::
                variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x16c146);
                std::get<mir::inst::VarId,int,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)0x16c153);
                std::
                make_unique<mir::inst::StoreOffsetInst,mir::inst::Value&,mir::inst::VarId&,mir::inst::Value&>
                          ((Value *)in_stack_fffffffffffff5c8,(VarId *)in_stack_fffffffffffff5c0,
                           in_stack_fffffffffffff5b8);
                std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                unique_ptr<mir::inst::StoreOffsetInst,std::default_delete<mir::inst::StoreOffsetInst>,void>
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                           (unique_ptr<mir::inst::StoreOffsetInst,_std::default_delete<mir::inst::StoreOffsetInst>_>
                            *)in_stack_fffffffffffff558._M_node);
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             *)in_stack_fffffffffffff550,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
                std::
                unique_ptr<mir::inst::StoreOffsetInst,_std::default_delete<mir::inst::StoreOffsetInst>_>
                ::~unique_ptr((unique_ptr<mir::inst::StoreOffsetInst,_std::default_delete<mir::inst::StoreOffsetInst>_>
                               *)in_stack_fffffffffffff550);
              }
            }
          }
        }
      }
    }
    std::_List_iterator<unsigned_int>::operator++(&local_50);
  }
  local_648 = in_RDI + 0xc0;
  local_650._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                 ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  local_658._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                 ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  while (bVar1 = std::operator!=(&local_650,&local_658), bVar1) {
    puVar17 = std::_List_iterator<unsigned_int>::operator*((_List_iterator<unsigned_int> *)0x16c3ce)
    ;
    local_65c = *puVar17;
    local_668 = std::
                vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                              *)(in_RDI + 8),(ulong)local_65c);
    std::
    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16c406);
    sVar5 = std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                      ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                       in_stack_fffffffffffff550);
    if (sVar5 != 0) {
      peVar19 = std::
                __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x16c429);
      local_670 = &peVar19->live_vars;
      local_678._M_node =
           (_List_node_base *)
           std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                     ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                      CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      local_680._M_node =
           (_List_node_base *)
           std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                     ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                      CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      while (bVar1 = std::operator!=(&local_678,&local_680), bVar1) {
        std::_List_iterator<mir::inst::VarId>::operator*
                  ((_List_iterator<mir::inst::VarId> *)0x16c48a);
        pVVar13 = &local_690;
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffff550,
                   (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
        std::
        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16c4ac);
        std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                  (pVVar13,in_stack_fffffffffffff5a0);
        std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
        unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                   (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *
                   )in_stack_fffffffffffff558._M_node);
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)in_stack_fffffffffffff550,
                    (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
        std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
        ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                     *)in_stack_fffffffffffff550);
        std::_List_iterator<mir::inst::VarId>::operator++(&local_678);
      }
    }
    std::_List_iterator<unsigned_int>::operator++(&local_650);
  }
  local_6a8 = local_10 + 0x58;
  bVar1 = std::optional<mir::inst::VarId>::has_value((optional<mir::inst::VarId> *)0x16c599);
  if ((bVar1) &&
     (pVVar13 = std::optional<mir::inst::VarId>::value
                          ((optional<mir::inst::VarId> *)in_stack_fffffffffffff550),
     pVVar13->id != 0)) {
    std::optional<mir::inst::VarId>::value((optional<mir::inst::VarId> *)in_stack_fffffffffffff550);
    mir::inst::VarId::VarId
              ((VarId *)in_stack_fffffffffffff550,
               (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
    this_01 = (vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
               *)(in_RDI + 8);
    pmVar14 = std::
              map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
              ::operator[](in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    local_6c0 = std::
                vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                ::operator[](this_01,(ulong)pmVar14->id);
    std::
    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16c624);
    std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x16c634);
    mir::inst::VarId::VarId
              ((VarId *)in_stack_fffffffffffff550,
               (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
    std::optional<mir::inst::VarId>::operator=
              ((optional<mir::inst::VarId> *)
               CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               (VarId *)in_stack_fffffffffffff558._M_node);
    local_6d8._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
    while( true ) {
      local_6e0 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)in_stack_fffffffffffff550,
                         (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      if (!bVar1) break;
      local_6e8 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  ::operator*(&local_6d8);
      pIVar15 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           0x16c6cf);
      bVar1 = mir::inst::VarId::operator==(&pIVar15->dest,&local_6d0);
      if (bVar1) {
        pIVar15 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                  operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             0x16c6f9);
        iVar2 = (*(pIVar15->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 1) {
          local_6f8 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          dVar16 = __gnu_cxx::operator-
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff550,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_6ec = (undefined4)dVar16;
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff550,
                      (value_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_708 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_700 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      __gnu_cxx::
                      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      ::operator+((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                   *)in_stack_fffffffffffff558._M_node,
                                  (difference_type)in_stack_fffffffffffff550);
          local_6d8 = (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                       )local_700;
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
          ::
          __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                    ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      *)in_stack_fffffffffffff550,
                     (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_710 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                              in_stack_fffffffffffff568);
          local_6d8._M_current = local_710;
          break;
        }
      }
      local_720 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  __gnu_cxx::
                  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  ::operator++((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                *)in_stack_fffffffffffff558._M_node,
                               (int)((ulong)in_stack_fffffffffffff550 >> 0x20));
    }
    std::
    __shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16c819);
    var_replace::Var_Replace::Var_Replace(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    local_790 = in_RDI + 0xc0;
    local_798._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                   ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
    local_7a0._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
    while (bVar1 = std::operator!=(&local_798,&local_7a0), bVar1) {
      puVar17 = std::_List_iterator<unsigned_int>::operator*
                          ((_List_iterator<unsigned_int> *)0x16c894);
      local_7a4 = *puVar17;
      local_7b0 = std::
                  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                                *)(in_RDI + 8),(ulong)local_7a4);
      std::
      __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x16c8cc);
      sVar5 = std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                        ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                         in_stack_fffffffffffff550);
      if (sVar5 != 0) {
        std::optional<mir::inst::VarId>::optional((optional<mir::inst::VarId> *)0x16c8ef);
        std::
        __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16c8fc);
        bVar1 = mir::inst::Value::is_immediate((Value *)0x16c908);
        if (bVar1) {
          peVar19 = std::
                    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x16c9f3);
          local_7e0 = &peVar19->live_vars;
          local_7e8._M_node =
               (_List_node_base *)
               std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                         ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                          CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_7f0._M_node =
               (_List_node_base *)
               std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                         ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                          CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          while (bVar1 = std::operator!=(&local_7e8,&local_7f0), bVar1) {
            std::_List_iterator<mir::inst::VarId>::operator*
                      ((_List_iterator<mir::inst::VarId> *)0x16ca51);
            mir::inst::VarId::VarId
                      ((VarId *)in_stack_fffffffffffff550,
                       (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            std::
            __shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16ca6d);
            pmVar18 = std::
                      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            *)in_stack_fffffffffffff570,
                           (key_type_conflict *)in_stack_fffffffffffff568._M_current);
            if ((pmVar18->is_phi_var & 1U) == 0) {
              std::optional<mir::inst::VarId>::operator=
                        ((optional<mir::inst::VarId> *)
                         CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                         (VarId *)in_stack_fffffffffffff558._M_node);
              break;
            }
            std::_List_iterator<mir::inst::VarId>::operator++(&local_7e8);
          }
        }
        else {
          std::
          __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16c91d);
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x16c929);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffff550,
                     (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          std::
          __shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16c94e);
          pmVar18 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)in_stack_fffffffffffff570,
                         (key_type_conflict *)in_stack_fffffffffffff568._M_current);
          if ((pmVar18->is_phi_var & 1U) == 0) {
            std::optional<mir::inst::VarId>::operator=
                      ((optional<mir::inst::VarId> *)
                       CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                       (VarId *)in_stack_fffffffffffff558._M_node);
            std::
            __shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16c995);
            pmVar18 = std::
                      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            *)in_stack_fffffffffffff570,
                           (key_type_conflict *)in_stack_fffffffffffff568._M_current);
            pmVar18->is_temp_var = false;
          }
        }
        bVar1 = std::optional<mir::inst::VarId>::has_value((optional<mir::inst::VarId> *)0x16cacd);
        if (bVar1) {
          peVar19 = std::
                    __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x16cae3);
          local_808 = &peVar19->live_vars;
          local_810._M_node =
               (_List_node_base *)
               std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                         ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                          CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          local_818._M_node =
               (_List_node_base *)
               std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                         ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                          CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
          while (bVar1 = std::operator!=(&local_810,&local_818), bVar1) {
            std::_List_iterator<mir::inst::VarId>::operator*
                      ((_List_iterator<mir::inst::VarId> *)0x16cb44);
            mir::inst::VarId::VarId
                      ((VarId *)in_stack_fffffffffffff550,
                       (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
            std::
            __shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16cb60);
            in_stack_fffffffffffff570 =
                 std::
                 map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)in_stack_fffffffffffff570,
                      (key_type_conflict *)in_stack_fffffffffffff568._M_current);
            if ((in_stack_fffffffffffff570->is_phi_var & 1U) == 0) {
              in_stack_fffffffffffff564 =
                   mir::inst::VarId::operator_cast_to_unsigned_int((VarId *)(local_848 + 0x20));
              in_stack_fffffffffffff568._M_current =
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   std::optional<mir::inst::VarId>::value
                             ((optional<mir::inst::VarId> *)in_stack_fffffffffffff550);
              uVar3 = mir::inst::VarId::operator_cast_to_unsigned_int
                                ((VarId *)in_stack_fffffffffffff568._M_current);
              if (in_stack_fffffffffffff564 != uVar3) {
                mir::inst::VarId::VarId
                          ((VarId *)in_stack_fffffffffffff550,
                           (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                in_stack_fffffffffffff558._M_node =
                     (_List_node_base *)
                     std::optional<mir::inst::VarId>::value
                               ((optional<mir::inst::VarId> *)in_stack_fffffffffffff550);
                in_stack_fffffffffffff550 = (Var_Replace *)local_848;
                mir::inst::VarId::VarId
                          ((VarId *)in_stack_fffffffffffff550,
                           (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                var_replace::Var_Replace::replace
                          (in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                           in_stack_fffffffffffff680);
              }
            }
            std::_List_iterator<mir::inst::VarId>::operator++(&local_810);
          }
        }
      }
      std::_List_iterator<unsigned_int>::operator++(&local_798);
    }
    var_replace::Var_Replace::~Var_Replace(in_stack_fffffffffffff550);
  }
  return;
}

Assistant:

void export_insts(mir::inst::BasicBlk& block) {
    auto& inst = block.inst;
    for (auto iter = nodes.begin(); iter != nodes.end(); ++iter) {
      iter->get()->init_main_var();
    }
    while (added.size() < nodes.size()) {
      for (int i = nodes.size() - 1; i >= 0; --i) {
        exportNode(i);
      }
    }
    inst.clear();
    // for (auto& varpair : var_map) {
    //   if (varpair.first > 10000) {
    //     break;
    //   }
    //   if (varpair.first >= 1) {
    //     inst.push_back(std::make_unique<mir::inst::AssignInst>(
    //         std::get<mir::inst::VarId>(nodes[varpair.second.id]->mainVar),
    //         varpair.first));
    //   }
    // }
    std::reverse(exportQueue.begin(), exportQueue.end());
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (!node->is_leaf) {
        auto opKind = node->op.index();
        switch (opKind) {
          case 0: {
            auto lhs = convert_operand_to_value(node->operands[0]);
            auto rhs = convert_operand_to_value(node->operands[1]);
            auto opInst = std::make_unique<mir::inst::OpInst>(
                std::get<mir::inst::VarId>(node->mainVar), lhs, rhs,
                std::get<NormOp>(node->op));
            inst.push_back(std::move(opInst));
            break;
          }

          case 1: {
            switch (std::get<ExtraNormOp>(node->op)) {
              case ExtraNormOp::Ref: {
                std::variant<mir::inst::VarId, std::string> val;
                if (node->operands[0].index() == 1) {
                  val = std::get<mir::inst::VarId>(
                      nodes[std::get<NodeId>(node->operands[0]).id]->mainVar);
                  //这里可能的VarId是局部数组，理论上不会出现int成为mainVar的情况

                } else {
                  val = std::get<std::string>(node->operands[0]);
                }
                inst.push_back(std::make_unique<mir::inst::RefInst>(
                    std::get<mir::inst::VarId>(node->mainVar), val));
                break;
              }
              case ExtraNormOp::Ptroffset: {
                auto ptr = std::get<mir::inst::VarId>(
                    convert_operand_to_value(node->operands[0]));
                auto offset = convert_operand_to_value(node->operands[1]);
                auto ptrInst = std::make_unique<mir::inst::PtrOffsetInst>(
                    std::get<mir::inst::VarId>(node->mainVar), ptr, offset);
                inst.push_back(std::move(ptrInst));
                break;
              }
              case ExtraNormOp::Assign: {
                mir::inst::Value src(0);
                auto operand = node->operands[0];
                if (operand.index() == 1) {
                  auto srcId = std::get<NodeId>(node->operands[0]);
                  src = nodes[srcId.id]->mainVar;
                } else {
                  src = std::get<int>(operand);
                }

                auto assignInst = std::make_unique<mir::inst::AssignInst>(
                    std::get<mir::inst::VarId>(node->mainVar), src);
                inst.push_back(std::move(assignInst));
                break;
              }
              case ExtraNormOp::Call: {
                auto func = std::get<std::string>(
                    node->operands[node->operands.size() - 1]);
                node->operands.pop_back();
                std::vector<mir::inst::Value> params;
                for (auto operand : node->operands) {
                  params.push_back(convert_operand_to_value(operand));
                }
                auto callInst = std::make_unique<mir::inst::CallInst>(
                    std::get<mir::inst::VarId>(node->mainVar), func, params);
                inst.push_back(std::move(callInst));
              }
            }

            break;
          }

          case 2: {
            if (std::get<InNormOp>(node->op) == InNormOp::Call) {
              auto func = std::get<std::string>(
                  node->operands[node->operands.size() - 1]);
              node->operands.pop_back();
              std::vector<mir::inst::Value> params;
              for (auto operand : node->operands) {
                params.push_back(convert_operand_to_value(operand));
              }
              auto callInst = std::make_unique<mir::inst::CallInst>(
                  std::get<mir::inst::VarId>(node->mainVar), func, params);
              inst.push_back(std::move(callInst));
            }
            if (std::get<InNormOp>(node->op) == InNormOp::Phi) {
              std::vector<mir::inst::VarId> vars;
              for (auto operand : node->operands) {
                auto oper_node = nodes[std::get<NodeId>(operand).id];
                mir::inst::VarId var;
                if (oper_node->mainVar.index() == 0) {
                  // imm

                  if (oper_node->live_vars.size()) {
                    var = oper_node->live_vars.front();
                  } else {
                    var = oper_node->local_vars.front();
                    auto assignInst = std::make_unique<mir::inst::AssignInst>(
                        var, node->mainVar);
                    inst.push_back(std::move(assignInst));
                  }
                } else {
                  var = std::get<mir::inst::VarId>(oper_node->mainVar);
                }
                vars.push_back(var);
              }
              auto phiInst = std::make_unique<mir::inst::PhiInst>(
                  std::get<mir::inst::VarId>(node->mainVar), vars);
              inst.push_back(std::move(phiInst));
            } else if (std::get<InNormOp>(node->op) == InNormOp::Load) {
              auto src = nodes[std::get<NodeId>(node->operands[0]).id]->mainVar;
              if (offset_inst) {
                auto offset = convert_operand_to_value(node->operands[1]);
                auto loadInst = std::make_unique<mir::inst::LoadOffsetInst>(
                    src, std::get<mir::inst::VarId>(node->mainVar), offset);
                inst.push_back(std::move(loadInst));
              } else {
                auto loadInst = std::make_unique<mir::inst::LoadInst>(
                    src, std::get<mir::inst::VarId>(node->mainVar));
                inst.push_back(std::move(loadInst));
              }

            } else if (std::get<InNormOp>(node->op) == InNormOp::Store) {
              auto val = convert_operand_to_value(node->operands[0]);
              auto dest = convert_operand_to_value(node->operands[1]);
              if (offset_inst) {
                auto offset = convert_operand_to_value(node->operands[2]);
                auto loadInst = std::make_unique<mir::inst::StoreOffsetInst>(
                    val, std::get<mir::inst::VarId>(dest), offset);
                inst.push_back(std::move(loadInst));
              } else {
                auto storeInst = std::make_unique<mir::inst::StoreInst>(
                    val, std::get<mir::inst::VarId>(dest));
                inst.push_back(std::move(storeInst));
              }
            }
            break;
          }
          default:;
        }
      }
      // if (node->live_vars.size()) {
      //   for (auto var : node->live_vars) {
      //     //
      //     if(node->op.index()==1&&std::get<ExtraNormOp>(node->op)==ExtraNormOp::Assign&&node->operands)
      //     auto assignInst =
      //         std::make_unique<mir::inst::AssignInst>(var, node->mainVar);
      //     inst.push_back(std::move(assignInst));
      //   }
      // }
    }
    // this must be in the end, or the livevar might overides the leaf var used
    // after this because they share the same reg
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (node->live_vars.size()) {
        for (auto var : node->live_vars) {
          auto assignInst =
              std::make_unique<mir::inst::AssignInst>(var, node->mainVar);
          inst.push_back(std::move(assignInst));
        }
      }
    }

    auto& jump = block.jump;
    if (!jump.cond_or_ret.has_value() || jump.cond_or_ret.value().id == 0) {
      return;
    }
    auto varId = jump.cond_or_ret.value();
    auto& node = nodes[var_map[varId].id];
    mir::inst::VarId var = std::get<mir::inst::VarId>(node->mainVar);
    jump.cond_or_ret = var;
    for (auto iter = block.inst.begin(); iter != block.inst.end();) {
      auto& inst = *iter;
      if (inst->dest == var && inst->inst_kind() == mir::inst::InstKind::Op) {
        int idx = iter - block.inst.begin();
        block.inst.push_back(std::move(inst));
        iter = block.inst.begin() + idx;
        iter = block.inst.erase(iter);

        break;
      } else {
        iter++;
      }
    }

    // replace
    var_replace::Var_Replace vp(env->func);
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (node->live_vars.size()) {
        std::optional<mir::inst::VarId> not_phi_var;
        if (!node->mainVar.is_immediate()) {
          auto var = std::get<mir::inst::VarId>(node->mainVar);
          if (!env->func.variables.at(var.id).is_phi_var) {
            not_phi_var = var;
            env->func.variables.at(var.id).is_temp_var = false;
          }
        } else {
          for (auto var : node->live_vars) {
            if (!env->func.variables.at(var.id).is_phi_var) {
              not_phi_var = var;
              break;
            }
          }
        }

        if (not_phi_var.has_value()) {
          for (auto var : node->live_vars) {
            if (!env->func.variables.at(var.id).is_phi_var &&
                var != not_phi_var.value()) {
              vp.replace(var, not_phi_var.value());
            }
          }
        }
      }
    }
  }